

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure_test.cc
# Opt level: O0

void __thiscall
xLearn::DMATRIX_TEST_CopyFrom_Test::~DMATRIX_TEST_CopyFrom_Test(DMATRIX_TEST_CopyFrom_Test *this)

{
  void *in_RDI;
  
  ~DMATRIX_TEST_CopyFrom_Test((DMATRIX_TEST_CopyFrom_Test *)0x15c8e8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(DMATRIX_TEST, CopyFrom) {
  DMatrix matrix;
  matrix.Reset();
  for (size_t i = 0; i < kLength; ++i) {
    matrix.AddRow();
    matrix.AddNode(i, i, 2.5, i);
    matrix.Y[i] = i;
    matrix.norm[i] = 0.25;
  }
  matrix.SetHash(1234, 5678);
  // Copy matrix
  DMatrix new_matrix;
  new_matrix.CopyFrom(&matrix);
  matrix.Reset();
  // Check
  EXPECT_EQ(new_matrix.row_length, kLength);
  EXPECT_EQ(new_matrix.hash_value_1, 1234);
  EXPECT_EQ(new_matrix.hash_value_2, 5678);
  EXPECT_EQ(new_matrix.has_label, true);
  for (size_t i = 0; i < kLength; ++i) {
    EXPECT_EQ(new_matrix.Y[i], i);
    EXPECT_EQ(new_matrix.norm[i], 0.25);
    SparseRow *row =new_matrix.row[i];
    for (SparseRow::iterator iter = row->begin();
         iter != row->end(); ++iter) {
      EXPECT_EQ(iter->field_id, i);
      EXPECT_EQ(iter->feat_id, i);
      EXPECT_FLOAT_EQ(iter->feat_val, 2.5);
    }
  }
}